

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::AddBox(Element *this,Box *box,Vector2f offset)

{
  PositionedBox local_68;
  Box *local_20;
  Box *box_local;
  Element *this_local;
  Vector2f offset_local;
  
  local_68.box.area_edges[2]._8_8_ = *(undefined8 *)(box->area_edges[2] + 2);
  local_68.box.content = box->content;
  local_68.box.area_edges[0]._0_8_ = *(undefined8 *)box->area_edges[0];
  local_68.box.area_edges[0]._8_8_ = *(undefined8 *)(box->area_edges[0] + 2);
  local_68.box.area_edges[1]._0_8_ = *(undefined8 *)box->area_edges[1];
  local_68.box.area_edges[1]._8_8_ = *(undefined8 *)(box->area_edges[1] + 2);
  local_68.box.area_edges[2]._0_8_ = *(undefined8 *)box->area_edges[2];
  local_68.offset = offset;
  local_20 = box;
  box_local = (Box *)this;
  this_local = (Element *)offset;
  ::std::vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::
  emplace_back<Rml::Element::PositionedBox>(&this->additional_boxes,&local_68);
  PositionedBox::~PositionedBox(&local_68);
  (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xc])();
  ElementBackgroundBorder::DirtyBackground(&this->meta->background_border);
  ElementBackgroundBorder::DirtyBorder(&this->meta->background_border);
  ElementEffects::DirtyEffectsData(&this->meta->effects);
  return;
}

Assistant:

void Element::AddBox(const Box& box, Vector2f offset)
{
	additional_boxes.emplace_back(PositionedBox{box, offset});
	OnResize();
	meta->background_border.DirtyBackground();
	meta->background_border.DirtyBorder();
	meta->effects.DirtyEffectsData();
}